

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamReaderPrivate::putString(QXmlStreamReaderPrivate *this,QStringView s,qsizetype from)

{
  CutResult CVar1;
  long lVar2;
  uint *puVar3;
  long lVar4;
  storage_type_conflict *psVar5;
  qsizetype qVar6;
  long lVar7;
  const_reverse_iterator end;
  long in_FS_OFFSET;
  QStringView s_00;
  qsizetype local_30;
  long local_28;
  long local_20;
  
  qVar6 = s.m_size;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (from == 0) {
    lVar2 = (this->putStack).tos + qVar6;
    lVar4 = (this->putStack).cap;
    if (lVar4 <= lVar2) {
      lVar2 = lVar2 + 1;
      lVar7 = lVar4 * 2;
      if (lVar2 != lVar7 && SBORROW8(lVar2,lVar7) == lVar2 + lVar4 * -2 < 0) {
        lVar7 = lVar2;
      }
      (this->putStack).cap = lVar7;
      puVar3 = (uint *)realloc((this->putStack).data,lVar7 << 2);
      (this->putStack).data = puVar3;
      if (puVar3 == (uint *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          qBadAlloc();
        }
        goto LAB_003930b4;
      }
    }
    if (qVar6 != 0) {
      puVar3 = (this->putStack).data;
      lVar4 = (this->putStack).tos;
      lVar2 = qVar6 * 2;
      do {
        puVar3[lVar4 + 1] = (uint)*(ushort *)((long)s.m_data + lVar2 + -2);
        lVar4 = lVar4 + 1;
        lVar2 = lVar2 + -2;
      } while (lVar2 != 0);
      (this->putStack).tos = lVar4;
    }
  }
  else {
    local_30 = -1;
    local_28 = from;
    CVar1 = QtPrivate::QContainerImplHelper::mid(qVar6,&local_28,&local_30);
    psVar5 = (storage_type_conflict *)0x0;
    qVar6 = 0;
    if (CVar1 != Null) {
      psVar5 = s.m_data + local_28;
      qVar6 = local_30;
    }
    s_00.m_data = psVar5;
    s_00.m_size = qVar6;
    putString(this,s_00,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_003930b4:
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::putString(QStringView s, qsizetype from)
{
    if (from != 0) {
        putString(s.mid(from));
        return;
    }
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it)
        putStack.rawPush() = it->unicode();
}